

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int gtStripSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  undefined1 auVar2 [16];
  uchar *puVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint32_t uVar7;
  tmsize_t tVar8;
  char *module;
  uint uVar9;
  char *fmt;
  TIFF *pTVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint32_t *puVar16;
  uint32_t uVar17;
  int iVar18;
  long size_to_read;
  bool bVar19;
  uchar *local_d8;
  uint32_t rowsperstrip;
  TIFF *local_c0;
  uchar *local_b8;
  uchar *local_b0;
  uchar *local_a8;
  uchar *buf;
  ulong local_98;
  uint local_8c;
  tmsize_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint32_t *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  tmsize_t local_48;
  anon_union_8_3_994a2fbf_for_put local_40;
  ulong local_38;
  
  pTVar10 = img->tif;
  local_40 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  local_98 = (ulong)img->width;
  local_88 = TIFFStripSize(pTVar10);
  local_c0 = pTVar10;
  local_48 = _TIFFMultiplySSize(pTVar10,4 - (ulong)(iVar1 == 0),local_88,"gtStripSeparate");
  if (local_48 == 0) {
LAB_00260a4e:
    iVar12 = 0;
  }
  else {
    uVar6 = setorientation(img);
    pTVar10 = local_c0;
    local_70 = 0;
    if ((uVar6 & 1) != 0) {
      if ((int)w < 0) {
        module = TIFFFileName(local_c0);
        fmt = "Width overflow";
LAB_00260a41:
        TIFFErrorExtR(pTVar10,module,fmt);
        goto LAB_00260a4e;
      }
      local_70 = (ulong)(w * -2);
    }
    iVar12 = *(int *)&img->photometric;
    bVar19 = (ushort)iVar12 < 4;
    uVar11 = 3;
    if (bVar19) {
      uVar11 = (uint)(0x1000300010001 >> ((byte)(iVar12 << 4) & 0x3f));
    }
    bVar5 = bVar19 & 0xbU >> ((byte)iVar12 & 0xf);
    local_68 = raster;
    TIFFGetFieldDefaulted(local_c0,0x116,&rowsperstrip);
    local_58 = TIFFScanlineSize(pTVar10);
    uVar9 = (uint)local_98;
    local_98 = (ulong)(uVar9 - w);
    if (uVar9 < w) {
      local_98 = 0;
    }
    local_50 = local_88 * 3;
    local_80 = (ulong)w;
    local_8c = uVar11 & 0xffff;
    uVar14 = 0;
    local_a8 = (uchar *)0x0;
    local_b8 = (uchar *)0x0;
    local_b0 = (uchar *)0x0;
    local_d8 = (uchar *)0x0;
    local_78 = (ulong)h;
    local_60 = (ulong)w;
    while( true ) {
      uVar4 = local_58;
      puVar3 = buf;
      pTVar10 = local_c0;
      uVar9 = (uint)local_78;
      uVar11 = (uint)uVar14;
      if (uVar9 < uVar11 || uVar9 - uVar11 == 0) break;
      uVar17 = img->row_offset + uVar11;
      iVar18 = rowsperstrip - uVar17 % rowsperstrip;
      if (uVar9 < iVar18 + uVar11) {
        iVar18 = uVar9 - uVar11;
      }
      uVar13 = (ulong)(uVar17 % rowsperstrip + iVar18);
      local_38 = uVar14;
      if ((0 < (long)local_58) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = local_58,
         SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < uVar13)) {
        module = TIFFFileName(local_c0);
        fmt = "Integer overflow in gtStripSeparate";
        goto LAB_00260a41;
      }
      uVar7 = TIFFComputeStrip(local_c0,uVar17,0);
      size_to_read = uVar4 * uVar13;
      if (puVar3 == (uchar *)0x0) {
        tVar8 = _TIFFReadEncodedStripAndAllocBuffer(pTVar10,uVar7,&buf,local_48,size_to_read);
        local_d8 = buf;
        if ((tVar8 != -1) || ((iVar12 = 0, buf != (uchar *)0x0 && (img->stoponerr == 0)))) {
          if (bVar5 != 0) {
            local_a8 = (uchar *)0x0;
            if (iVar1 != 0) {
              local_a8 = buf + local_50;
            }
            local_b0 = buf;
            local_b8 = buf;
            goto LAB_00260878;
          }
          local_b0 = buf + local_88;
          local_b8 = local_b0 + local_88;
          local_a8 = (uchar *)0x0;
          if (iVar1 != 0) {
            local_a8 = local_b8 + local_88;
          }
LAB_0026080e:
          uVar7 = TIFFComputeStrip(pTVar10,uVar17,1);
          tVar8 = TIFFReadEncodedStrip(pTVar10,uVar7,local_b0,size_to_read);
          if ((tVar8 != -1) || (img->stoponerr == 0)) {
            uVar7 = TIFFComputeStrip(pTVar10,uVar17,2);
            tVar8 = TIFFReadEncodedStrip(pTVar10,uVar7,local_b8,size_to_read);
            if ((tVar8 != -1) || (img->stoponerr == 0)) goto LAB_00260878;
          }
LAB_00260996:
          iVar12 = 0;
        }
        goto LAB_00260998;
      }
      tVar8 = TIFFReadEncodedStrip(pTVar10,uVar7,local_d8,size_to_read);
      if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_00260996;
      if (bVar5 == 0) goto LAB_0026080e;
LAB_00260878:
      uVar14 = local_58;
      if (iVar1 != 0) {
        uVar17 = TIFFComputeStrip(pTVar10,uVar17,(uint16_t)local_8c);
        tVar8 = TIFFReadEncodedStrip(pTVar10,uVar17,local_a8,uVar13 * uVar14);
        if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_00260996;
      }
      iVar12 = (int)local_38;
      (*local_40.any)(img);
      uVar14 = (ulong)(uint)(iVar12 + iVar18);
    }
    iVar12 = 1;
LAB_00260998:
    if (1 < uVar6) {
      uVar6 = 0;
      for (uVar14 = 0; uVar14 != (local_78 & 0xffffffff); uVar14 = uVar14 + 1) {
        puVar15 = local_68 + local_80 + ((ulong)uVar6 - 1);
        for (puVar16 = local_68 + (uint)((int)uVar14 * (int)local_60); puVar16 < puVar15;
            puVar16 = puVar16 + 1) {
          uVar17 = *puVar16;
          *puVar16 = *puVar15;
          *puVar15 = uVar17;
          puVar15 = puVar15 + -1;
        }
        uVar6 = uVar6 + (int)local_60;
      }
    }
    _TIFFfreeExt(img->tif,buf);
  }
  return iVar12;
}

Assistant:

static int gtStripSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                           uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL, *p1 = NULL, *p2 = NULL, *pa = NULL;
    uint32_t row, y, nrow, rowstoread;
    tmsize_t pos;
    tmsize_t scanline;
    uint32_t rowsperstrip, offset_row;
    uint32_t imagewidth = img->width;
    tmsize_t stripsize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    int ret = 1, flip;
    uint16_t colorchannels;

    stripsize = TIFFStripSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, stripsize, "gtStripSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        offset_row = row + img->row_offset;
        temp = (row + img->row_offset) % rowsperstrip + nrow;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripSeparate");
            return 0;
        }
        if (buf == NULL)
        {
            if (_TIFFReadEncodedStripAndAllocBuffer(
                    tif, TIFFComputeStrip(tif, offset_row, 0), (void **)&buf,
                    bufsize, temp * scanline) == (tmsize_t)(-1) &&
                (buf == NULL || img->stoponerr))
            {
                ret = 0;
                break;
            }
            p0 = buf;
            if (colorchannels == 1)
            {
                p2 = p1 = p0;
                pa = (alpha ? (p0 + 3 * stripsize) : NULL);
            }
            else
            {
                p1 = p0 + stripsize;
                p2 = p1 + stripsize;
                pa = (alpha ? (p2 + stripsize) : NULL);
            }
        }
        else if (TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 0),
                                      p0, temp * scanline) == (tmsize_t)(-1) &&
                 img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 1), p1,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 2), p2,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (alpha)
        {
            if (TIFFReadEncodedStrip(
                    tif, TIFFComputeStrip(tif, offset_row, colorchannels), pa,
                    temp * scanline) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew, p0 + pos,
               p1 + pos, p2 + pos, (alpha ? (pa + pos) : NULL));
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}